

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O0

void __thiscall
embree::OBJLoader::OBJLoader
          (OBJLoader *this,FileName *fileName,bool subdivMode,bool combineIntoSingleObject)

{
  size_t sVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  undefined1 uVar6;
  int iVar7;
  uint uVar8;
  GroupNode *pGVar9;
  char *pcVar10;
  runtime_error *this_00;
  long *plVar11;
  Ref<embree::SceneGraph::MaterialNode> *pRVar12;
  undefined1 *puVar13;
  ulong uVar14;
  long lVar15;
  size_t sVar16;
  avector<Vec3fa> *paVar17;
  Vec3fa *pVVar18;
  unsigned_long *puVar19;
  byte in_CL;
  byte in_DL;
  OBJLoader *in_RDI;
  bool bVar20;
  Vertex VVar21;
  string name;
  uint b;
  uint a;
  float w;
  float t;
  float r;
  uint i_13;
  uint i_8;
  avector<Vec3ff> hair;
  uint N;
  bool plane;
  Vertex vtx;
  vector<embree::Vertex,_std::allocator<embree::Vertex>_> face;
  char *token;
  string next_line;
  string line;
  Ref<embree::SceneGraph::MaterialNode> defaultMaterial;
  ifstream cin;
  Vec3fa v_1;
  Vec3fa v;
  Vec3fx v_2;
  size_t i_17;
  size_t i_16;
  size_t i_14;
  size_t i_15;
  size_t i_3;
  size_t i_2;
  Vec3fa *old_items;
  size_t i_1;
  size_t i;
  size_t i_7;
  size_t i_6;
  Vec3fa *old_items_1;
  size_t i_5;
  size_t i_4;
  size_t new_size_alloced;
  size_t new_size_alloced_1;
  size_t i_12;
  size_t i_11;
  Vec3fx *old_items_2;
  size_t i_10;
  size_t i_9;
  size_t new_size_alloced_2;
  value_type *in_stack_fffffffffffff3e8;
  OBJLoader *in_stack_fffffffffffff3f0;
  value_type *in_stack_fffffffffffff3f8;
  OBJLoader *in_stack_fffffffffffff400;
  OBJMaterial *in_stack_fffffffffffff408;
  GroupNode *in_stack_fffffffffffff410;
  key_type *in_stack_fffffffffffff428;
  string *in_stack_fffffffffffff430;
  undefined7 in_stack_fffffffffffff438;
  undefined1 in_stack_fffffffffffff43f;
  bool local_aee;
  allocator local_949;
  string local_948 [64];
  _Self local_908;
  _Self local_900;
  allocator local_8f1;
  string local_8f0 [36];
  Crease local_8cc;
  uint local_8c0;
  uint local_8bc;
  float local_8b8;
  float local_8b4;
  float local_8b0;
  uint local_8ac;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  uint local_884;
  undefined1 local_880 [8];
  ulong local_878;
  ulong local_870;
  void *local_868;
  uint local_860;
  bool local_859;
  Vertex local_858;
  Vertex local_848;
  undefined4 local_814;
  undefined4 local_810;
  uint local_80c;
  undefined1 local_808 [8];
  ulong uStack_800;
  undefined4 local_7f4;
  undefined4 local_7f0;
  uint local_7ec;
  undefined1 local_7e8 [8];
  ulong uStack_7e0;
  char *local_7d8;
  int local_7cc;
  string local_7c8 [32];
  string local_7a8 [38];
  undefined1 local_782;
  allocator local_781;
  string local_780 [32];
  long *local_760;
  undefined1 local_751;
  string local_730 [32];
  istream local_710 [542];
  byte local_4f2;
  byte local_4f1;
  GroupNode *local_4e0;
  avector<Vec3fa> *local_4d0;
  avector<Vec3fa> *local_4c8;
  Ref<embree::SceneGraph::MaterialNode> *local_4c0;
  long *local_4b8;
  long **local_4b0;
  mapped_type *local_4a8;
  Ref<embree::SceneGraph::MaterialNode> *local_4a0;
  long **local_498;
  Ref<embree::SceneGraph::MaterialNode> *local_490;
  long **local_488;
  Ref<embree::SceneGraph::MaterialNode> *local_480;
  undefined8 local_478;
  ulong uStack_470;
  undefined1 *local_468;
  avector<Vec3fa> *local_460;
  undefined8 local_458;
  ulong uStack_450;
  undefined1 *local_440;
  avector<Vec3fa> *local_438;
  undefined4 *local_430;
  undefined1 *local_428;
  undefined4 *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 *local_3f8;
  undefined1 *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  ulong local_3d8;
  undefined1 *local_3d0;
  ulong local_3c8;
  undefined1 *local_3c0;
  ulong local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  long **local_398;
  ulong uStack_360;
  undefined4 local_34c;
  ulong uStack_340;
  undefined4 local_32c;
  undefined8 *local_328;
  Vec3fa *local_320;
  undefined1 *local_318;
  undefined8 *local_310;
  undefined8 *local_308;
  Vec3fa *local_300;
  undefined1 *local_2f8;
  undefined8 *local_2f0;
  ulong local_288;
  undefined1 *local_280;
  ulong local_278;
  void *local_270;
  undefined1 *local_268;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined8 *local_238;
  undefined8 *local_230;
  ulong local_228;
  ulong local_220;
  Vec3fa *local_218;
  ulong local_210;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  avector<Vec3fa> *local_1f0;
  Vec3fa *local_1e8;
  Vec3fa *local_1e0;
  ulong local_1d8;
  avector<Vec3fa> *local_1d0;
  size_t local_1c8;
  Vec3fa *local_1c0;
  avector<Vec3fa> *local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  Vec3fa *local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  avector<Vec3fa> *local_178;
  FileName *in_stack_fffffffffffffe90;
  OBJLoader *in_stack_fffffffffffffe98;
  unsigned_long local_138 [2];
  ulong local_128;
  ulong local_120;
  avector<Vec3fa> *local_118;
  ulong local_110;
  unsigned_long local_108 [2];
  ulong local_f8;
  ulong local_f0;
  avector<Vec3fa> *local_e8;
  ulong local_e0;
  Vec3fa *local_d8;
  Vec3fa *local_d0;
  Vec3fa *local_c8;
  Vec3fa *local_c0;
  ulong local_b8;
  ulong local_b0;
  void *local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  undefined1 *local_80;
  ulong local_78;
  void *local_70;
  undefined1 *local_68;
  ulong local_60;
  undefined1 *local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  unsigned_long local_40 [2];
  ulong local_30;
  ulong local_28;
  undefined1 *local_20;
  ulong local_18;
  void *local_10;
  void *local_8;
  
  local_4f1 = in_DL & 1;
  local_4f2 = in_CL & 1;
  pGVar9 = (GroupNode *)::operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(in_stack_fffffffffffff410,(size_t)in_stack_fffffffffffff408);
  (in_RDI->group).ptr = pGVar9;
  local_4e0 = pGVar9;
  if ((in_RDI->group).ptr != (GroupNode *)0x0) {
    (*(((in_RDI->group).ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  embree::FileName::path((FileName *)CONCAT17(in_stack_fffffffffffff43f,in_stack_fffffffffffff438));
  in_RDI->subdivMode = (bool)(local_4f1 & 1);
  local_4d0 = &in_RDI->v;
  (in_RDI->v).size_active = 0;
  (in_RDI->v).size_alloced = 0;
  (in_RDI->v).items = (Vec3fa *)0x0;
  local_4c8 = &in_RDI->vn;
  (in_RDI->vn).size_active = 0;
  (in_RDI->vn).size_alloced = 0;
  (in_RDI->vn).items = (Vec3fa *)0x0;
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::vector
            ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)0x1998cc);
  std::vector<embree::Crease,_std::allocator<embree::Crease>_>::vector
            ((vector<embree::Crease,_std::allocator<embree::Crease>_> *)0x1998e8);
  std::
  vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
  ::vector((vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
            *)0x199904);
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::vector((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            *)0x199920);
  std::__cxx11::string::string((string *)&in_RDI->curMaterialName);
  local_4c0 = &in_RDI->curMaterial;
  local_4c0->ptr = (MaterialNode *)0x0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
         *)0x199985);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
         *)0x1999a1);
  std::ifstream::ifstream(local_710);
  pcVar10 = embree::FileName::c_str((FileName *)0x1999bd);
  std::ifstream::open((char *)local_710,(_Ios_Openmode)pcVar10);
  bVar5 = std::ifstream::is_open();
  if ((bVar5 & 1) == 0) {
    local_751 = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    embree::FileName::str_abi_cxx11_((FileName *)in_stack_fffffffffffff3e8);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffff43f,in_stack_fffffffffffff438),
                   in_stack_fffffffffffff430);
    std::runtime_error::runtime_error(this_00,local_730);
    local_751 = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  plVar11 = (long *)SceneGraph::MaterialNode::operator_new(0x199b8b);
  local_782 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_780,"default",&local_781);
  OBJMaterial::OBJMaterial(in_stack_fffffffffffff408,(string *)in_stack_fffffffffffff400);
  local_782 = 0;
  local_4b0 = &local_760;
  local_4b8 = plVar11;
  local_760 = plVar11;
  if (plVar11 != (long *)0x0) {
    (**(code **)(*plVar11 + 0x10))();
  }
  std::__cxx11::string::~string(local_780);
  std::allocator<char>::~allocator((allocator<char> *)&local_781);
  std::__cxx11::string::operator=((string *)&in_RDI->curMaterialName,"default");
  pRVar12 = &in_RDI->curMaterial;
  local_488 = &local_760;
  local_480 = pRVar12;
  if (local_760 != (long *)0x0) {
    (**(code **)(*local_760 + 0x10))();
  }
  if (pRVar12->ptr != (MaterialNode *)0x0) {
    (*(pRVar12->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  pRVar12->ptr = (MaterialNode *)*local_488;
  do {
    iVar7 = std::istream::peek();
    if (iVar7 == -1) {
      flushFaceGroup(in_stack_fffffffffffff3f0);
      std::ifstream::close();
      local_398 = &local_760;
      if (local_760 != (long *)0x0) {
        (**(code **)(*local_760 + 0x18))();
      }
      std::ifstream::~ifstream(local_710);
      return;
    }
    std::__cxx11::string::string(local_7a8);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_710,local_7a8);
    do {
      uVar8 = std::__cxx11::string::empty();
      bVar20 = false;
      if ((uVar8 & 1) == 0) {
        std::__cxx11::string::size();
        pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)local_7a8);
        bVar20 = *pcVar10 == '\\';
      }
      if (!bVar20) break;
      std::__cxx11::string::size();
      puVar13 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_7a8);
      *puVar13 = 0x20;
      std::__cxx11::string::string(local_7c8);
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_710,local_7c8);
      uVar14 = std::__cxx11::string::empty();
      if ((uVar14 & 1) == 0) {
        std::__cxx11::string::operator+=(local_7a8,local_7c8);
        local_7cc = 0;
      }
      else {
        local_7cc = 5;
      }
      std::__cxx11::string::~string(local_7c8);
    } while (local_7cc == 0);
    lVar15 = std::__cxx11::string::c_str();
    pcVar10 = (char *)std::__cxx11::string::c_str();
    sVar16 = strspn(pcVar10," \t");
    local_7d8 = trimEnd((char *)(lVar15 + sVar16));
    if (*local_7d8 == '\0') {
      local_7cc = 2;
    }
    else {
      if (*local_7d8 == 'v') {
        bVar20 = isSep(local_7d8[1]);
        if (bVar20) {
          paVar17 = &in_RDI->v;
          local_7d8 = local_7d8 + 2;
          getVec3f((char **)in_stack_fffffffffffff408);
          local_428 = local_7e8;
          local_430 = &local_7f4;
          local_458 = CONCAT44(local_7f0,local_7f4);
          local_32c = 0;
          uStack_340 = (ulong)local_7ec;
          local_440 = local_7e8;
          local_310 = &local_458;
          uVar14 = (in_RDI->v).size_active;
          local_120 = (in_RDI->v).size_active + 1;
          local_438 = paVar17;
          local_318 = local_440;
          local_118 = paVar17;
          uStack_7e0 = uStack_340;
          uStack_450 = uStack_340;
          if ((in_RDI->v).size_alloced < local_120) {
            uVar3 = local_120;
            if ((in_RDI->v).size_alloced != 0) {
              local_128 = (in_RDI->v).size_alloced;
              while (local_128 < local_120) {
                local_138[1] = 1;
                local_138[0] = local_128 << 1;
                puVar19 = std::max<unsigned_long>(local_138 + 1,local_138);
                local_128 = *puVar19;
              }
              local_110 = local_128;
              uVar3 = local_110;
            }
          }
          else {
            uVar3 = (in_RDI->v).size_alloced;
          }
          local_110 = uVar3;
          local_200 = local_110;
          uVar3 = uVar14;
          if (uVar14 < (in_RDI->v).size_active) {
            while (local_208 = uVar3, local_208 < (in_RDI->v).size_active) {
              uVar3 = local_208 + 1;
            }
            (in_RDI->v).size_active = uVar14;
          }
          local_1f8 = uVar14;
          local_1f0 = paVar17;
          if (local_110 == (in_RDI->v).size_alloced) {
            for (local_210 = (in_RDI->v).size_active; local_210 < uVar14; local_210 = local_210 + 1)
            {
              local_c8 = (in_RDI->v).items + local_210;
            }
            (in_RDI->v).size_active = uVar14;
          }
          else {
            local_218 = (in_RDI->v).items;
            local_1d8 = local_110;
            local_1d0 = paVar17;
            pVVar18 = (Vec3fa *)
                      alignedMalloc((size_t)in_stack_fffffffffffff3f8,
                                    (size_t)in_stack_fffffffffffff3f0);
            (in_RDI->v).items = pVVar18;
            for (local_220 = 0; local_220 < (in_RDI->v).size_active; local_220 = local_220 + 1) {
              local_1e0 = (in_RDI->v).items + local_220;
              local_1e8 = local_218 + local_220;
              uVar2 = *(undefined8 *)((long)&local_1e8->field_0 + 8);
              *(undefined8 *)&local_1e0->field_0 = *(undefined8 *)&local_1e8->field_0;
              *(undefined8 *)((long)&local_1e0->field_0 + 8) = uVar2;
            }
            for (local_228 = (in_RDI->v).size_active; local_228 < local_1f8;
                local_228 = local_228 + 1) {
              local_c0 = (in_RDI->v).items + local_228;
            }
            local_1c8 = (in_RDI->v).size_alloced;
            local_1c0 = local_218;
            local_1b8 = paVar17;
            alignedFree(in_stack_fffffffffffff3e8);
            (in_RDI->v).size_active = local_1f8;
            (in_RDI->v).size_alloced = local_200;
          }
          sVar1 = (in_RDI->v).size_active;
          (in_RDI->v).size_active = sVar1 + 1;
          local_320 = (in_RDI->v).items + sVar1;
          local_328 = &local_458;
          *(undefined8 *)&local_320->field_0 = local_458;
          *(ulong *)((long)&local_320->field_0 + 8) = uStack_450;
          local_7cc = 2;
          goto LAB_0019be92;
        }
      }
      if ((*local_7d8 == 'v') && (local_7d8[1] == 'n')) {
        bVar20 = isSep(local_7d8[2]);
        if (bVar20) {
          paVar17 = &in_RDI->vn;
          local_7d8 = local_7d8 + 3;
          getVec3f((char **)in_stack_fffffffffffff408);
          local_418 = local_808;
          local_420 = &local_814;
          local_478 = CONCAT44(local_810,local_814);
          local_34c = 0;
          uStack_360 = (ulong)local_80c;
          local_468 = local_808;
          local_2f0 = &local_478;
          uVar14 = (in_RDI->vn).size_active;
          local_f0 = (in_RDI->vn).size_active + 1;
          local_460 = paVar17;
          local_2f8 = local_468;
          local_e8 = paVar17;
          uStack_800 = uStack_360;
          uStack_470 = uStack_360;
          if ((in_RDI->vn).size_alloced < local_f0) {
            uVar3 = local_f0;
            if ((in_RDI->vn).size_alloced != 0) {
              local_f8 = (in_RDI->vn).size_alloced;
              while (local_f8 < local_f0) {
                local_108[1] = 1;
                local_108[0] = local_f8 << 1;
                puVar19 = std::max<unsigned_long>(local_108 + 1,local_108);
                local_f8 = *puVar19;
              }
              local_e0 = local_f8;
              uVar3 = local_e0;
            }
          }
          else {
            uVar3 = (in_RDI->vn).size_alloced;
          }
          local_e0 = uVar3;
          local_188 = local_e0;
          uVar3 = uVar14;
          if (uVar14 < (in_RDI->vn).size_active) {
            while (local_190 = uVar3, local_190 < (in_RDI->vn).size_active) {
              uVar3 = local_190 + 1;
            }
            (in_RDI->vn).size_active = uVar14;
          }
          local_180 = uVar14;
          local_178 = paVar17;
          if (local_e0 == (in_RDI->vn).size_alloced) {
            for (local_198 = (in_RDI->vn).size_active; local_198 < uVar14; local_198 = local_198 + 1
                ) {
              local_d8 = (in_RDI->vn).items + local_198;
            }
            (in_RDI->vn).size_active = uVar14;
          }
          else {
            local_1a0 = (in_RDI->vn).items;
            pVVar18 = (Vec3fa *)
                      alignedMalloc((size_t)in_stack_fffffffffffff3f8,
                                    (size_t)in_stack_fffffffffffff3f0);
            (in_RDI->vn).items = pVVar18;
            for (local_1a8 = 0; local_1a8 < (in_RDI->vn).size_active; local_1a8 = local_1a8 + 1) {
              in_stack_fffffffffffffe98 = (OBJLoader *)((in_RDI->vn).items + local_1a8);
              in_stack_fffffffffffffe90 = (FileName *)(local_1a0 + local_1a8);
              uVar2 = *(undefined8 *)((long)&in_stack_fffffffffffffe90->filename + 8);
              *(undefined8 *)&in_stack_fffffffffffffe98->group =
                   *(undefined8 *)&in_stack_fffffffffffffe90->filename;
              *(undefined8 *)&(in_stack_fffffffffffffe98->path).filename = uVar2;
            }
            for (local_1b0 = (in_RDI->vn).size_active; local_1b0 < local_180;
                local_1b0 = local_1b0 + 1) {
              local_d0 = (in_RDI->vn).items + local_1b0;
            }
            alignedFree(in_stack_fffffffffffff3e8);
            (in_RDI->vn).size_active = local_180;
            (in_RDI->vn).size_alloced = local_188;
          }
          sVar1 = (in_RDI->vn).size_active;
          (in_RDI->vn).size_active = sVar1 + 1;
          local_300 = (in_RDI->vn).items + sVar1;
          local_308 = &local_478;
          *(undefined8 *)&local_300->field_0 = local_478;
          *(ulong *)((long)&local_300->field_0 + 8) = uStack_470;
          local_7cc = 2;
          goto LAB_0019be92;
        }
      }
      if ((*local_7d8 == 'v') && (local_7d8[1] == 't')) {
        bVar20 = isSep(local_7d8[2]);
        if (bVar20) {
          local_7d8 = local_7d8 + 3;
          getVec2f((char **)in_stack_fffffffffffff400);
          std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::push_back
                    ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
                     in_stack_fffffffffffff3f0,(value_type *)in_stack_fffffffffffff3e8);
          local_7cc = 2;
          goto LAB_0019be92;
        }
      }
      if (*local_7d8 == 'f') {
        bVar20 = isSep(local_7d8[1]);
        if (bVar20) {
          local_7d8 = local_7d8 + 1;
          parseSep((char **)in_stack_fffffffffffff400);
          std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>::vector
                    ((vector<embree::Vertex,_std::allocator<embree::Vertex>_> *)0x19ac99);
          while (*local_7d8 != '\0') {
            VVar21 = getUInt3(in_stack_fffffffffffff400,(char **)in_stack_fffffffffffff3f8);
            local_858 = VVar21;
            local_848 = VVar21;
            std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>::push_back
                      ((vector<embree::Vertex,_std::allocator<embree::Vertex>_> *)
                       in_stack_fffffffffffff400,(value_type *)in_stack_fffffffffffff3f8);
            parseSepOpt((char **)0x19ad30);
          }
          std::
          vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
          ::push_back((vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
                       *)in_stack_fffffffffffff400,(value_type *)in_stack_fffffffffffff3f8);
          local_7cc = 2;
          std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>::~vector
                    ((vector<embree::Vertex,_std::allocator<embree::Vertex>_> *)
                     in_stack_fffffffffffff400);
          goto LAB_0019be92;
        }
      }
      iVar7 = strncmp(local_7d8,"hair",4);
      if (iVar7 == 0) {
        bVar20 = isSep(local_7d8[4]);
        if (bVar20) {
          local_7d8 = local_7d8 + 4;
          parseSep((char **)in_stack_fffffffffffff400);
          iVar7 = strncmp(local_7d8,"plane",5);
          local_aee = false;
          if (iVar7 == 0) {
            local_aee = isSep(local_7d8[5]);
          }
          local_859 = local_aee;
          if (local_aee == false) {
            iVar7 = strncmp(local_7d8,"cylinder",8);
            if (iVar7 == 0) {
              bVar20 = isSep(local_7d8[8]);
              if (bVar20) {
                local_7d8 = local_7d8 + 8;
                parseSep((char **)in_stack_fffffffffffff400);
                goto LAB_0019af15;
              }
            }
            local_7cc = 2;
            goto LAB_0019be92;
          }
          local_7d8 = local_7d8 + 5;
          parseSep((char **)in_stack_fffffffffffff400);
LAB_0019af15:
          local_860 = getInt((char **)in_stack_fffffffffffff3f0);
          local_410 = local_880;
          local_878 = 0;
          local_870 = 0;
          local_868 = (void *)0x0;
          for (local_884 = 0; local_884 < local_860 * 3 + 1; local_884 = local_884 + 1) {
            getVec3fa((char **)in_stack_fffffffffffff410);
            uVar14 = local_878;
            local_3e0 = &local_898;
            local_3e8 = &local_8a8;
            local_898 = local_8a8;
            uStack_890 = uStack_8a0;
            local_3f8 = &local_898;
            local_230 = &local_408;
            local_408 = local_8a8;
            uStack_400 = uStack_8a0;
            local_28 = local_878 + 1;
            local_3f0 = local_880;
            local_238 = local_3f8;
            local_20 = local_880;
            if (local_870 < local_28) {
              uVar3 = local_28;
              if (local_870 != 0) {
                local_30 = local_870;
                while (local_30 < local_28) {
                  local_40[1] = 1;
                  local_40[0] = local_30 << 1;
                  puVar19 = std::max<unsigned_long>(local_40 + 1,local_40);
                  local_30 = *puVar19;
                }
                local_18 = local_30;
                uVar3 = local_18;
              }
            }
            else {
              uVar3 = local_870;
            }
            local_18 = uVar3;
            local_90 = local_18;
            uVar3 = uVar14;
            uVar4 = local_878;
            if (uVar14 < local_878) {
              while (local_98 = uVar3, uVar4 = uVar14, local_98 < local_878) {
                uVar3 = local_98 + 1;
              }
            }
            local_878 = uVar4;
            local_80 = local_880;
            if (local_18 == local_870) {
              for (local_a0 = local_878; local_878 = uVar14, local_a0 < uVar14;
                  local_a0 = local_a0 + 1) {
                local_10 = (void *)((long)local_868 + local_a0 * 0x10);
              }
            }
            else {
              local_a8 = local_868;
              local_60 = local_18;
              local_88 = uVar14;
              local_58 = local_880;
              local_868 = alignedMalloc((size_t)in_stack_fffffffffffff3f8,
                                        (size_t)in_stack_fffffffffffff3f0);
              for (local_b0 = 0; local_b0 < local_878; local_b0 = local_b0 + 1) {
                local_48 = (undefined8 *)((long)local_868 + local_b0 * 0x10);
                local_50 = (undefined8 *)((long)local_a8 + local_b0 * 0x10);
                uVar2 = local_50[1];
                *local_48 = *local_50;
                local_48[1] = uVar2;
              }
              for (local_b8 = local_878; local_b8 < local_88; local_b8 = local_b8 + 1) {
                local_8 = (void *)((long)local_868 + local_b8 * 0x10);
              }
              local_78 = local_870;
              local_70 = local_a8;
              local_68 = local_880;
              alignedFree(in_stack_fffffffffffff3e8);
              local_878 = local_88;
              local_870 = local_90;
            }
            local_240 = (undefined8 *)((long)local_868 + local_878 * 0x10);
            local_248 = &local_408;
            *local_240 = local_408;
            local_240[1] = uStack_400;
            local_88 = local_878;
            local_878 = local_878 + 1;
          }
          for (local_8ac = 0; local_8ac < local_860 + 1; local_8ac = local_8ac + 1) {
            local_8b0 = getFloat((char **)in_stack_fffffffffffff3f0);
            iVar7 = getInt((char **)in_stack_fffffffffffff3f0);
            local_8b4 = (float)iVar7;
            if (local_8ac != 0) {
              local_3b8 = (ulong)(local_8ac * 3 - 1);
              local_3b0 = local_880;
              *(float *)((long)local_868 + local_3b8 * 0x10 + 0xc) = local_8b0;
            }
            local_3c8 = (ulong)(local_8ac * 3);
            local_3c0 = local_880;
            *(float *)((long)local_868 + local_3c8 * 0x10 + 0xc) = local_8b0;
            if (local_8ac != local_860) {
              local_3d8 = (ulong)(local_8ac * 3 + 1);
              local_3d0 = local_880;
              *(float *)((long)local_868 + local_3d8 * 0x10 + 0xc) = local_8b0;
            }
          }
          std::
          vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
          ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       *)in_stack_fffffffffffff400,in_stack_fffffffffffff3f8);
          local_3a8 = local_880;
          for (local_288 = 0; local_288 < local_878; local_288 = local_288 + 1) {
          }
          local_278 = local_870;
          local_270 = local_868;
          local_280 = local_3a8;
          local_268 = local_3a8;
          alignedFree(in_stack_fffffffffffff3e8);
          local_868 = (void *)0x0;
          local_870 = 0;
          local_878 = 0;
        }
      }
      if ((*local_7d8 == 'e') && (local_7d8[1] == 'c')) {
        bVar20 = isSep(local_7d8[2]);
        if (bVar20) {
          local_7d8 = local_7d8 + 2;
          parseSep((char **)in_stack_fffffffffffff400);
          local_8b8 = getFloat((char **)in_stack_fffffffffffff3f0);
          parseSepOpt((char **)0x19b8ed);
          iVar7 = getInt((char **)in_stack_fffffffffffff3f0);
          local_8bc = fix_v(in_RDI,iVar7);
          parseSepOpt((char **)0x19b93d);
          iVar7 = getInt((char **)in_stack_fffffffffffff3f0);
          local_8c0 = fix_v(in_RDI,iVar7);
          parseSepOpt((char **)0x19b98d);
          Crease::Crease(&local_8cc,local_8b8,local_8bc,local_8c0);
          std::vector<embree::Crease,_std::allocator<embree::Crease>_>::push_back
                    ((vector<embree::Crease,_std::allocator<embree::Crease>_> *)
                     in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8);
          local_7cc = 2;
          goto LAB_0019be92;
        }
      }
      iVar7 = strncmp(local_7d8,"usemtl",6);
      if (iVar7 == 0) {
        bVar20 = isSep(local_7d8[6]);
        if (bVar20) {
          if ((local_4f2 & 1) == 0) {
            flushFaceGroup(in_stack_fffffffffffff3f0);
          }
          local_7d8 = local_7d8 + 6;
          pcVar10 = parseSep((char **)in_stack_fffffffffffff400);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_8f0,pcVar10,&local_8f1);
          std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
          local_900._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                       *)in_stack_fffffffffffff3e8,(key_type *)0x19badb);
          local_908._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                      *)in_stack_fffffffffffff3e8);
          bVar20 = std::operator==(&local_900,&local_908);
          if (bVar20) {
            pRVar12 = &in_RDI->curMaterial;
            local_498 = &local_760;
            local_490 = pRVar12;
            if (local_760 != (long *)0x0) {
              (**(code **)(*local_760 + 0x10))();
            }
            if (pRVar12->ptr != (MaterialNode *)0x0) {
              (*(pRVar12->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
            }
            pRVar12->ptr = (MaterialNode *)*local_498;
            std::__cxx11::string::operator=((string *)&in_RDI->curMaterialName,"default");
          }
          else {
            local_4a8 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                                      *)in_stack_fffffffffffff430,in_stack_fffffffffffff428);
            pRVar12 = &in_RDI->curMaterial;
            local_4a0 = pRVar12;
            if (local_4a8->ptr != (MaterialNode *)0x0) {
              (*(local_4a8->ptr->super_Node).super_RefCount._vptr_RefCount[2])();
            }
            if (pRVar12->ptr != (MaterialNode *)0x0) {
              (*(pRVar12->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
            }
            pRVar12->ptr = local_4a8->ptr;
            std::__cxx11::string::operator=((string *)&in_RDI->curMaterialName,local_8f0);
          }
          local_7cc = 2;
          std::__cxx11::string::~string(local_8f0);
          goto LAB_0019be92;
        }
      }
      iVar7 = strncmp(local_7d8,"mtllib",6);
      if (iVar7 == 0) {
        uVar6 = isSep(local_7d8[6]);
        if ((bool)uVar6) {
          in_stack_fffffffffffff428 = &(in_RDI->path).filename;
          local_7d8 = local_7d8 + 6;
          in_stack_fffffffffffff430 = (string *)parseSep((char **)in_stack_fffffffffffff400);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_948,(char *)in_stack_fffffffffffff430,&local_949);
          embree::FileName::operator+
                    ((FileName *)CONCAT17(uVar6,in_stack_fffffffffffff438),in_stack_fffffffffffff430
                    );
          loadMTL(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
          embree::FileName::~FileName((FileName *)0x19bdf7);
          std::__cxx11::string::~string(local_948);
          std::allocator<char>::~allocator((allocator<char> *)&local_949);
          local_7cc = 2;
          goto LAB_0019be92;
        }
      }
      local_7cc = 0;
    }
LAB_0019be92:
    std::__cxx11::string::~string(local_7a8);
  } while( true );
}

Assistant:

OBJLoader::OBJLoader(const FileName &fileName, const bool subdivMode, const bool combineIntoSingleObject) 
    : group(new SceneGraph::GroupNode), path(fileName.path()), subdivMode(subdivMode)
  {
    /* open file */
    std::ifstream cin;
    cin.open(fileName.c_str());
    if (!cin.is_open()) {
      THROW_RUNTIME_ERROR("cannot open " + fileName.str());
      return;
    }

    /* generate default material */
    Ref<SceneGraph::MaterialNode> defaultMaterial = new OBJMaterial("default");
    curMaterialName = "default";
    curMaterial = defaultMaterial;

    while (cin.peek() != -1)
    {
      /* load next multiline */
      std::string line; std::getline(cin,line);
      while (!line.empty() && line[line.size()-1] == '\\') {
	line[line.size()-1] = ' ';
	std::string next_line; std::getline(cin,next_line);
	if (next_line.empty()) break;
	line += next_line;
      }
      const char* token = trimEnd(line.c_str() + strspn(line.c_str(), " \t"));
      if (token[0] == 0) continue;

      /*! parse position */
      if (token[0] == 'v' && isSep(token[1])) { 
        v.push_back(getVec3f(token += 2)); continue;
      }

      /* parse normal */
      if (token[0] == 'v' && token[1] == 'n' && isSep(token[2])) { 
        vn.push_back(getVec3f(token += 3)); 
        continue; 
      }

      /* parse texcoord */
      if (token[0] == 'v' && token[1] == 't' && isSep(token[2])) { vt.push_back(getVec2f(token += 3)); continue; }

      /*! parse face */
      if (token[0] == 'f' && isSep(token[1]))
      {
        parseSep(token += 1);

        std::vector<Vertex> face;
        while (token[0]) {
	  Vertex vtx = getUInt3(token);
          face.push_back(vtx);
          parseSepOpt(token);
        }
        curGroup.push_back(face);
        continue;
      }

      /*! parse corona hair */
      if (!strncmp(token,"hair",4) && isSep(token[4]))
      {
        parseSep(token += 4);
        bool plane = !strncmp(token,"plane",5) && isSep(token[5]);
        if (plane) {
          parseSep(token += 5);
        }
        else if (!strncmp(token,"cylinder",8) && isSep(token[8])) {
          parseSep(token += 8);
        }
        else continue;

        unsigned int N = getInt(token);
        avector<Vec3ff> hair;
        for (unsigned int i=0; i<3*N+1; i++) {
          hair.push_back((Vec3ff)getVec3fa(token));
        }
        
        for (unsigned int i=0; i<N+1; i++)
        {
          float r = getFloat(token);
          MAYBE_UNUSED float t = (float)getInt(token);
          if (i != 0) hair[3*i-1].w = r;
          hair[3*i+0].w = r;
          if (i != N) hair[3*i+1].w = r;
        }
        curGroupHair.push_back(hair);
      }
      
      /*! parse edge crease */
      if (token[0] == 'e' && token[1] == 'c' && isSep(token[2]))
      {
	parseSep(token += 2);
	float w = getFloat(token);
	parseSepOpt(token);
	unsigned int a = fix_v(getInt(token));
	parseSepOpt(token);
	unsigned int b = fix_v(getInt(token));
	parseSepOpt(token);
	ec.push_back(Crease(w, a, b));
	continue;
      }

      /*! use material */
      if (!strncmp(token, "usemtl", 6) && isSep(token[6]))
      {
        if (!combineIntoSingleObject) flushFaceGroup();
        std::string name(parseSep(token += 6));
        if (material.find(name) == material.end()) {
          curMaterial = defaultMaterial;
          curMaterialName = "default";
        }
        else {
          curMaterial = material[name];
          curMaterialName = name;
        }
        continue;
      }

      /* load material library */
      if (!strncmp(token, "mtllib", 6) && isSep(token[6])) {
        loadMTL(path + std::string(parseSep(token += 6)));
        continue;
      }

      // ignore unknown stuff
    }
    flushFaceGroup();

    cin.close();
  }